

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImPool<ImGuiTable>::~ImPool(ImPool<ImGuiTable> *this)

{
  ImPool<ImGuiTable> *this_local;
  
  Clear(this);
  ImGuiStorage::~ImGuiStorage(&this->Map);
  ImVector<ImGuiTable>::~ImVector(&this->Buf);
  return;
}

Assistant:

~ImPool()   { Clear(); }